

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.cpp
# Opt level: O1

void __thiscall Perceptron::~Perceptron(Perceptron *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  pcVar2 = (this->m_label)._M_dataplus._M_p;
  paVar1 = &(this->m_label).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->m_activation).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_activation,(_Any_data *)&this->m_activation,__destroy_functor);
  }
  return;
}

Assistant:

Perceptron::~Perceptron(){}